

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSize __thiscall
QDockAreaLayout::size_helper<QSize(QDockAreaLayoutInfo::*)()const,QSize(QLayoutItem::*)()const>
          (QDockAreaLayout *this,offset_in_QDockAreaLayoutInfo_to_subr sizeFn,
          offset_in_QLayoutItem_to_subr centerFn)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  code *in_RCX;
  int iVar10;
  int iVar11;
  Representation RVar12;
  ulong uVar13;
  QSize QVar14;
  int iVar15;
  Representation RVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  QLayoutItem *pQVar20;
  int iVar21;
  long in_R8;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  undefined1 auVar26 [16];
  int local_64;
  code *pcVar6;
  
  if (this->centralWidgetItem == (QLayoutItem *)0x0) {
    iVar15 = 0;
    iVar23 = 0;
    local_64 = 0;
    iVar11 = 0;
  }
  else {
    uVar13 = 0;
    lVar25 = 0;
    do {
      if ((ulong)this->docks[0].item_list.d.size <= uVar13) {
        bVar2 = true;
        goto LAB_0040144a;
      }
      bVar2 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[0].item_list.d.ptr)->widgetItem + lVar25));
      lVar25 = lVar25 + 0x28;
      uVar13 = uVar13 + 1;
    } while (bVar2);
    bVar2 = lVar25 == 0;
LAB_0040144a:
    uVar13 = 0;
    iVar11 = 0;
    if (!bVar2) {
      iVar11 = this->sep;
    }
    lVar25 = 0;
    do {
      if ((ulong)this->docks[1].item_list.d.size <= uVar13) {
        bVar2 = true;
        goto LAB_0040148d;
      }
      bVar2 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[1].item_list.d.ptr)->widgetItem + lVar25));
      lVar25 = lVar25 + 0x28;
      uVar13 = uVar13 + 1;
    } while (bVar2);
    bVar2 = lVar25 == 0;
LAB_0040148d:
    uVar13 = 0;
    local_64 = 0;
    if (!bVar2) {
      local_64 = this->sep;
    }
    lVar25 = 0;
    do {
      if ((ulong)this->docks[2].item_list.d.size <= uVar13) {
        bVar2 = true;
        goto LAB_004014d4;
      }
      bVar2 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[2].item_list.d.ptr)->widgetItem + lVar25));
      lVar25 = lVar25 + 0x28;
      uVar13 = uVar13 + 1;
    } while (bVar2);
    bVar2 = lVar25 == 0;
LAB_004014d4:
    uVar13 = 0;
    iVar15 = 0;
    if (!bVar2) {
      iVar15 = this->sep;
    }
    lVar25 = 0;
    do {
      if ((ulong)this->docks[3].item_list.d.size <= uVar13) {
        bVar2 = true;
        goto LAB_00401517;
      }
      bVar2 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[3].item_list.d.ptr)->widgetItem + lVar25));
      lVar25 = lVar25 + 0x28;
      uVar13 = uVar13 + 1;
    } while (bVar2);
    bVar2 = lVar25 == 0;
LAB_00401517:
    iVar23 = 0;
    if (!bVar2) {
      iVar23 = this->sep;
    }
  }
  pcVar6 = (code *)sizeFn;
  if ((sizeFn & 1) != 0) {
    pcVar6 = *(code **)(*(long *)((long)&this->docks[0].sep + centerFn) + -1 + sizeFn);
  }
  uVar3 = (*pcVar6)();
  pcVar6 = (code *)sizeFn;
  if ((sizeFn & 1) != 0) {
    pcVar6 = *(code **)(*(long *)((long)&this->docks[1].sep + centerFn) + -1 + sizeFn);
  }
  uVar4 = (*pcVar6)();
  pcVar6 = (code *)sizeFn;
  if ((sizeFn & 1) != 0) {
    pcVar6 = *(code **)(*(long *)((long)&this->docks[2].sep + centerFn) + -1 + sizeFn);
  }
  uVar5 = (*pcVar6)();
  if ((sizeFn & 1) != 0) {
    sizeFn = *(undefined8 *)(*(long *)((long)&this->docks[3].sep + centerFn) + -1 + sizeFn);
  }
  uVar7 = (*(code *)sizeFn)();
  pQVar20 = this->centralWidgetItem;
  iVar24 = 0;
  iVar19 = 0;
  iVar9 = 0;
  uVar8 = 0;
  if (pQVar20 != (QLayoutItem *)0x0) {
    pQVar20 = (QLayoutItem *)((long)&pQVar20->_vptr_QLayoutItem + in_R8);
    if (((ulong)in_RCX & 1) != 0) {
      in_RCX = *(code **)(in_RCX + (long)pQVar20->_vptr_QLayoutItem + -1);
    }
    uVar8 = (*in_RCX)();
    iVar9 = (int)((ulong)uVar8 >> 0x20);
  }
  iVar23 = iVar23 + (int)((ulong)uVar7 >> 0x20);
  iVar15 = iVar15 + (int)((ulong)uVar5 >> 0x20);
  local_64 = local_64 + (int)uVar4;
  iVar11 = iVar11 + (int)uVar3;
  auVar26._0_4_ = -(uint)(this->corners[0] == LeftDockWidgetArea);
  auVar26._4_4_ = -(uint)(this->corners[1] == RightDockWidgetArea);
  auVar26._8_4_ = -(uint)(this->corners[2] == LeftDockWidgetArea);
  auVar26._12_4_ = -(uint)(this->corners[3] == RightDockWidgetArea);
  uVar18 = movmskps((int)pQVar20,auVar26);
  iVar21 = iVar15;
  iVar1 = 0;
  if ((uVar18 & 1) != 0) {
    iVar21 = iVar19;
    iVar1 = iVar11;
  }
  iVar22 = iVar15;
  iVar10 = 0;
  if ((uVar18 & 2) != 0) {
    iVar22 = iVar19;
    iVar10 = local_64;
  }
  iVar10 = iVar10 + iVar1 + (int)uVar5;
  iVar17 = iVar23;
  iVar1 = 0;
  if ((uVar18 & 4) != 0) {
    iVar17 = iVar19;
    iVar1 = iVar11;
  }
  iVar17 = iVar17 + iVar21 + (int)((ulong)uVar3 >> 0x20);
  iVar19 = local_64;
  if ((uVar18 & 8) == 0) {
    iVar24 = iVar23;
    iVar19 = 0;
  }
  iVar19 = iVar19 + iVar1 + (int)uVar7;
  iVar24 = iVar24 + iVar22 + (int)((ulong)uVar4 >> 0x20);
  RVar16.m_i = iVar15 + iVar23 + iVar9;
  RVar12.m_i = iVar11 + local_64 + (int)uVar8;
  if (RVar12.m_i <= iVar19) {
    RVar12.m_i = iVar19;
  }
  if (RVar12.m_i <= iVar10) {
    RVar12.m_i = iVar10;
  }
  if (RVar16.m_i <= iVar24) {
    RVar16.m_i = iVar24;
  }
  if (RVar16.m_i <= iVar17) {
    RVar16.m_i = iVar17;
  }
  QVar14.ht.m_i = RVar16.m_i;
  QVar14.wd.m_i = RVar12.m_i;
  return QVar14;
}

Assistant:

QSize QDockAreaLayout::size_helper(SizePMF sizeFn, CenterPMF centerFn) const
{
    int left_sep = 0;
    int right_sep = 0;
    int top_sep = 0;
    int bottom_sep = 0;

    if (centralWidgetItem != nullptr) {
        left_sep = docks[QInternal::LeftDock].isEmpty() ? 0 : sep;
        right_sep = docks[QInternal::RightDock].isEmpty() ? 0 : sep;
        top_sep = docks[QInternal::TopDock].isEmpty() ? 0 : sep;
        bottom_sep = docks[QInternal::BottomDock].isEmpty() ? 0 : sep;
    }

    const QSize left = (docks[QInternal::LeftDock].*sizeFn)() + QSize(left_sep, 0);
    const QSize right = (docks[QInternal::RightDock].*sizeFn)() + QSize(right_sep, 0);
    const QSize top = (docks[QInternal::TopDock].*sizeFn)() + QSize(0, top_sep);
    const QSize bottom = (docks[QInternal::BottomDock].*sizeFn)() + QSize(0, bottom_sep);
    const QSize center = centralWidgetItem == nullptr
                       ? QSize(0, 0) : (centralWidgetItem->*centerFn)();

    int row1 = top.width();
    int row2 = left.width() + center.width() + right.width();
    int row3 = bottom.width();
    int col1 = left.height();
    int col2 = top.height() + center.height() + bottom.height();
    int col3 = right.height();

    if (corners[Qt::TopLeftCorner] == Qt::LeftDockWidgetArea)
        row1 += left.width();
    else
        col1 += top.height();

    if (corners[Qt::TopRightCorner] == Qt::RightDockWidgetArea)
        row1 += right.width();
    else
        col3 += top.height();

    if (corners[Qt::BottomLeftCorner] == Qt::LeftDockWidgetArea)
        row3 += left.width();
    else
        col1 += bottom.height();

    if (corners[Qt::BottomRightCorner] == Qt::RightDockWidgetArea)
        row3 += right.width();
    else
        col3 += bottom.height();

    return QSize(qMax(row1, row2, row3), qMax(col1, col2, col3));
}